

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O2

void wallet::ErrorLogCallback(void *arg,int code,char *msg)

{
  long lVar1;
  string_view source_file;
  bool bVar2;
  Logger *pLVar3;
  char **in_R8;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view str;
  char *msg_local;
  int code_local;
  string local_50;
  string log_msg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  msg_local = msg;
  code_local = code;
  if (arg != (void *)0x0) {
    __assert_fail("arg == nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/sqlite.cpp"
                  ,0x2a,"void wallet::ErrorLogCallback(void *, int, const char *)");
  }
  pLVar3 = LogInstance();
  bVar2 = BCLog::Logger::Enabled(pLVar3);
  if (bVar2) {
    log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
    log_msg._M_string_length = 0;
    log_msg.field_2._M_local_buf[0] = '\0';
    tinyformat::format<int,char_const*>
              (&local_50,(tinyformat *)"SQLite Error. Code: %d. Message: %s\n",(char *)&code_local,
               (int *)&msg_local,in_R8);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&log_msg,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    pLVar3 = LogInstance();
    local_50._M_dataplus._M_p = (pointer)0x5a;
    local_50._M_string_length = 0x6fecdb;
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/sqlite.cpp"
    ;
    source_file._M_len = 0x5a;
    logging_function._M_str = "ErrorLogCallback";
    logging_function._M_len = 0x10;
    str._M_str = log_msg._M_dataplus._M_p;
    str._M_len = log_msg._M_string_length;
    BCLog::Logger::LogPrintStr(pLVar3,str,logging_function,source_file,0x2b,ALL,Info);
    std::__cxx11::string::~string((string *)&log_msg);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void ErrorLogCallback(void* arg, int code, const char* msg)
{
    // From sqlite3_config() documentation for the SQLITE_CONFIG_LOG option:
    // "The void pointer that is the second argument to SQLITE_CONFIG_LOG is passed through as
    // the first parameter to the application-defined logger function whenever that function is
    // invoked."
    // Assert that this is the case:
    assert(arg == nullptr);
    LogPrintf("SQLite Error. Code: %d. Message: %s\n", code, msg);
}